

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

bool __thiscall QGles2RenderBuffer::createFrom(QGles2RenderBuffer *this,NativeRenderBuffer src)

{
  QRhiGles2 *this_00;
  bool bVar1;
  int iVar2;
  bool bVar3;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (src.object == 0) {
    bVar3 = false;
  }
  else {
    if (this->renderbuffer != 0) {
      (*(this->super_QRhiRenderBuffer).super_QRhiResource._vptr_QRhiResource[3])(this);
    }
    this_00 = (QRhiGles2 *)(this->super_QRhiRenderBuffer).super_QRhiResource.m_rhi;
    iVar2 = QRhiImplementation::effectiveSampleCount
                      ((QRhiImplementation *)this_00,(this->super_QRhiRenderBuffer).m_sampleCount);
    this->samples = iVar2;
    if (((this->super_QRhiRenderBuffer).m_flags.super_QFlagsStorageHelper<QRhiRenderBuffer::Flag,_4>
         .super_QFlagsStorage<QRhiRenderBuffer::Flag>.i & 1) != 0) {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_30 = "default";
      QMessageLogger::warning(local_48);
    }
    bVar3 = false;
    bVar1 = QRhiGles2::ensureContext(this_00,(QSurface *)0x0);
    if (bVar1) {
      this->renderbuffer = (GLuint)src.object;
      this->owns = false;
      this->generation = this->generation + 1;
      QRhiImplementation::registerResource((QRhiImplementation *)this_00,(QRhiResource *)this,true);
      bVar3 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2RenderBuffer::createFrom(NativeRenderBuffer src)
{
    if (!src.object)
        return false;

    if (renderbuffer)
        destroy();

    QRHI_RES_RHI(QRhiGles2);
    samples = rhiD->effectiveSampleCount(m_sampleCount);

    if (m_flags.testFlag(UsedWithSwapChainOnly))
        qWarning("RenderBuffer: UsedWithSwapChainOnly is meaningless when importing an existing native object");

    if (!rhiD->ensureContext())
        return false;

    renderbuffer = src.object;

    owns = false;
    generation += 1;
    rhiD->registerResource(this);
    return true;
}